

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

void __thiscall
TempTracker<NumberTemp>::ProcessUse
          (TempTracker<NumberTemp> *this,StackSym *sym,BackwardPass *backwardPass)

{
  BVIndex i;
  uint dstSymID;
  Instr *instr;
  Opnd *this_00;
  bool bVar1;
  bool bVar2;
  RegOpnd *pRVar3;
  BVSparse<Memory::JitArenaAllocator> **ppBVar4;
  SymOpnd *pSVar5;
  PropertySym *propertySym;
  BackwardPass *backwardPass_00;
  char16_t *pcVar6;
  Instr *sym_00;
  char16_t *pcVar7;
  
  if (sym->m_type == TyVar) {
    instr = backwardPass->currentInstr;
    i = (sym->super_Sym).m_id;
    sym_00 = instr;
    bVar1 = NumberTemp::IsTempPropertyTransferStore(&this->super_NumberTemp,instr,backwardPass);
    pcVar7 = L"";
    if (!bVar1) {
      bVar2 = NumberTemp::IsTempUse(instr,(Sym *)sym_00,backwardPass_00);
      if (!bVar2) {
        BVSparse<Memory::JitArenaAllocator>::Set((BVSparse<Memory::JitArenaAllocator> *)this,i);
        pcVar7 = L"Non ";
      }
    }
    bVar2 = NumberTemp::DoTrace(backwardPass);
    if (bVar2) {
      pcVar6 = L"";
      if (backwardPass->currentPrePassLoop != (Loop *)0x0) {
        pcVar6 = L"Prepass ";
      }
      Output::Print(L"%s: %8s%4sTemp Use (s%-3d): ",L"MarkTempNumber",pcVar6,pcVar7,(ulong)i);
      IR::Instr::DumpSimple(instr);
      Output::Flush();
    }
    bVar2 = NumberTemp::IsTempTransfer(instr);
    if (bVar2) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (&(this->super_NumberTemp).super_TempTrackerBase.tempTransferredSyms,i);
      if ((this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies !=
          (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
        this_00 = instr->m_dst;
        bVar2 = IR::Opnd::IsRegOpnd(this_00);
        if (bVar2) {
          pRVar3 = IR::Opnd::AsRegOpnd(this_00);
          dstSymID = (pRVar3->m_sym->super_Sym).m_id;
          if (dstSymID != i) {
            TempTrackerBase::AddTransferDependencies
                      ((TempTrackerBase *)this,i,dstSymID,
                       (this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies);
            bVar2 = NumberTemp::DoTrace(backwardPass);
            if (bVar2) {
              pcVar7 = L"";
              if (backwardPass->currentPrePassLoop != (Loop *)0x0) {
                pcVar7 = L"Prepass ";
              }
              Output::Print(L"%s: %8s s%d -> s%d: ",L"MarkTempNumber",pcVar7,(ulong)dstSymID,
                            (ulong)i);
              ppBVar4 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::
                        Get((this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies,
                            i);
              BVSparse<Memory::JitArenaAllocator>::Dump(*ppBVar4);
            }
          }
        }
      }
    }
    if (bVar1) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (&(this->super_NumberTemp).super_TempTrackerBase.tempTransferredSyms,i);
      pSVar5 = IR::Opnd::AsSymOpnd(instr->m_dst);
      propertySym = Sym::AsPropertySym(pSVar5->m_sym);
      NumberTemp::PropagateTempPropertyTransferStoreDependencies
                (&this->super_NumberTemp,i,propertySym,backwardPass);
      bVar1 = NumberTemp::DoTrace(backwardPass);
      if ((bVar1) &&
         ((this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies !=
          (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)) {
        pcVar7 = L"Prepass ";
        if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
          pcVar7 = L"";
        }
        Output::Print(L"%s: %8s (PropId:%d)+[] -> s%d: ",L"MarkTempNumber",pcVar7,
                      (ulong)(uint)propertySym->m_propertyId,(ulong)i);
        ppBVar4 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Get
                            ((this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies
                             ,i);
        if (ppBVar4 != (BVSparse<Memory::JitArenaAllocator> **)0x0) {
          BVSparse<Memory::JitArenaAllocator>::Dump(*ppBVar4);
          return;
        }
        Output::Print(L"[]\n");
        return;
      }
    }
  }
  return;
}

Assistant:

void
TempTracker<T>::ProcessUse(StackSym * sym, BackwardPass * backwardPass)
{
    // Don't care about type specialized syms
    if (!sym->IsVar())
    {
        return;
    }
    IR::Instr * instr = backwardPass->currentInstr;
    SymID usedSymID = sym->m_id;
    bool isTempPropertyTransferStore = T::IsTempPropertyTransferStore(instr, backwardPass);
    bool isTempUse = isTempPropertyTransferStore || T::IsTempUse(instr, sym, backwardPass);
    if (!isTempUse)
    {
        this->nonTempSyms.Set(usedSymID);
    }
#if DBG
    if (T::DoTrace(backwardPass))
    {
        Output::Print(_u("%s: %8s%4sTemp Use (s%-3d): "), T::GetTraceName(),
            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), isTempUse ? _u("") : _u("Non "), usedSymID);
        instr->DumpSimple();
        Output::Flush();
    }
#endif
    if (T::IsTempTransfer(instr))
    {
        this->tempTransferredSyms.Set(usedSymID);

        // Track dependencies if we are in loop only
        if (this->tempTransferDependencies != nullptr)
        {
            IR::Opnd * dstOpnd = instr->GetDst();
            if (dstOpnd->IsRegOpnd())
            {
                SymID dstSymID = dstOpnd->AsRegOpnd()->m_sym->m_id;

                if (dstSymID != usedSymID)
                {
                    // Record that the usedSymID may propagate to dstSymID and all the symbols
                    // that it may propagate to as well
                    this->AddTransferDependencies(usedSymID, dstSymID, this->tempTransferDependencies);
#if DBG_DUMP
                    if (T::DoTrace(backwardPass))
                    {
                        Output::Print(_u("%s: %8s s%d -> s%d: "), T::GetTraceName(),
                            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), dstSymID, usedSymID);
                        (*this->tempTransferDependencies->Get(usedSymID))->Dump();
                    }
#endif
                }
            }
        }
    }

    if (isTempPropertyTransferStore)
    {
        this->tempTransferredSyms.Set(usedSymID);
        PropertySym * propertySym = instr->GetDst()->AsSymOpnd()->m_sym->AsPropertySym();
        this->PropagateTempPropertyTransferStoreDependencies(usedSymID, propertySym, backwardPass);

#if DBG_DUMP
        if (T::DoTrace(backwardPass) && this->tempTransferDependencies)
        {
            Output::Print(_u("%s: %8s (PropId:%d)+[] -> s%d: "), T::GetTraceName(),
                backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), propertySym->m_propertyId, usedSymID);
            BVSparse<JitArenaAllocator> ** transferDependencies = this->tempTransferDependencies->Get(usedSymID);
            if (transferDependencies)
            {
                (*transferDependencies)->Dump();
            }
            else
            {
                Output::Print(_u("[]\n"));
            }
        }
#endif
    }
}